

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

parser_error parse_renderer_combined_renderer(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *name;
  renderer_info *renderer;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = parser_getstr(p,"name");
    string_free(*(char **)((long)pvVar1 + 8));
    pcVar2 = string_make(pcVar2);
    *(char **)((long)pvVar1 + 8) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_renderer_combined_renderer(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *name;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "name");
	string_free(renderer->comb_rend_nm);
	renderer->comb_rend_nm = string_make(name);
	return PARSE_ERROR_NONE;
}